

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O0

void bgflusher_init(bgflusher_config *config)

{
  size_t *in_RDI;
  size_t i;
  ulong local_10;
  
  if (bgflusher_initialized == '\0') {
    pthread_mutex_init((pthread_mutex_t *)&bgf_lock,(pthread_mutexattr_t *)0x0);
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    if (bgflusher_initialized == '\0') {
      avl_init(&openfiles,(void *)0x0);
      bgflusher_terminate_signal = '\0';
      pthread_mutex_init((pthread_mutex_t *)&sync_mutex,(pthread_mutexattr_t *)0x0);
      pthread_cond_init((pthread_cond_t *)&sync_cond,(pthread_condattr_t *)0x0);
      num_bgflusher_threads = *in_RDI;
      bgflusher_tids = (pthread_t *)calloc(num_bgflusher_threads,8);
      for (local_10 = 0; local_10 < num_bgflusher_threads; local_10 = local_10 + 1) {
        pthread_create(bgflusher_tids + local_10,(pthread_attr_t *)0x0,bgflusher_thread,(void *)0x0)
        ;
      }
      bgflusher_initialized = '\x01';
    }
    pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
  }
  return;
}

Assistant:

void bgflusher_init(struct bgflusher_config *config)
{
    if (!bgflusher_initialized) {
        // Note that this function is synchronized by spin lock in fdb_init API.
        mutex_init(&bgf_lock);

        mutex_lock(&bgf_lock);
        if (!bgflusher_initialized) {
            // initialize
            avl_init(&openfiles, NULL);

            bgflusher_terminate_signal = 0;

            mutex_init(&sync_mutex);
            thread_cond_init(&sync_cond);

            // create worker threads
            num_bgflusher_threads = config->num_threads;
            bgflusher_tids = (thread_t *) calloc(num_bgflusher_threads,
                                                 sizeof(thread_t));
            for (size_t i = 0; i < num_bgflusher_threads; ++i) {
                thread_create(&bgflusher_tids[i], bgflusher_thread, NULL);
            }

            bgflusher_initialized = 1;
        }
        mutex_unlock(&bgf_lock);
    }
}